

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void rollback_to_zero_after_compact_test(bool multi_kv)

{
  int iVar1;
  fdb_status fVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  fdb_kvs_handle **ppfVar7;
  long lVar8;
  undefined7 in_register_00000039;
  ulong uVar9;
  long lVar10;
  fdb_file_handle *dbfile;
  int local_314;
  fdb_file_handle *dbfile_comp;
  fdb_kvs_handle *db [4];
  fdb_kvs_info info;
  char metabuf [64];
  char keybuf [64];
  fdb_kvs_config kvs_config;
  char kv_name [8];
  char bodybuf [64];
  timeval __test_begin;
  fdb_doc *doc [20];
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.compaction_threshold = '\0';
  fconfig.multi_kv_instances = multi_kv;
  fdb_open(&dbfile,"./mvcc_test1",&fconfig);
  local_314 = (int)CONCAT71(in_register_00000039,multi_kv);
  if (local_314 == 0) {
    fdb_kvs_open_default(dbfile,db,&kvs_config);
    lVar8 = 1;
  }
  else {
    ppfVar7 = db;
    lVar8 = 4;
    for (uVar9 = 0; uVar9 != 4; uVar9 = uVar9 + 1) {
      sprintf(kv_name,"kv%d",uVar9 & 0xffffffff);
      fdb_kvs_open(dbfile,ppfVar7,kv_name,&kvs_config);
      ppfVar7 = ppfVar7 + 1;
    }
  }
  lVar10 = 0;
  while (lVar8 != lVar10) {
    fVar2 = fdb_set_log_callback(db[lVar10],logCallbackFunc,"rollback_to_zero_after_compact_test");
    lVar10 = lVar10 + 1;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x10c4);
      rollback_to_zero_after_compact_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x10c4,"void rollback_to_zero_after_compact_test(bool)");
    }
  }
  for (uVar9 = 0; uVar9 != 5; uVar9 = uVar9 + 1) {
    sprintf(keybuf,"key%d",uVar9 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar9 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar9 & 0xffffffff);
    sVar3 = strlen(keybuf);
    sVar4 = strlen(metabuf);
    sVar5 = strlen(bodybuf);
    fdb_doc_create(doc + uVar9,keybuf,sVar3,metabuf,sVar4,bodybuf,sVar5);
    for (lVar10 = 0; lVar8 != lVar10; lVar10 = lVar10 + 1) {
      fdb_set(db[lVar10],doc[uVar9]);
    }
  }
  fdb_commit(dbfile,'\x01');
  for (uVar9 = 5; uVar9 != 10; uVar9 = uVar9 + 1) {
    sprintf(keybuf,"key%d",uVar9 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar9 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar9 & 0xffffffff);
    sVar3 = strlen(keybuf);
    sVar4 = strlen(metabuf);
    sVar5 = strlen(bodybuf);
    fdb_doc_create(doc + uVar9,keybuf,sVar3,metabuf,sVar4,bodybuf,sVar5);
    for (lVar10 = 0; lVar8 != lVar10; lVar10 = lVar10 + 1) {
      fdb_set(db[lVar10],doc[uVar9]);
    }
  }
  fdb_commit(dbfile,'\0');
  for (uVar9 = 10; uVar9 != 0xf; uVar9 = uVar9 + 1) {
    sprintf(keybuf,"key%d",uVar9 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar9 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar9 & 0xffffffff);
    sVar3 = strlen(keybuf);
    sVar4 = strlen(metabuf);
    sVar5 = strlen(bodybuf);
    fdb_doc_create(doc + uVar9,keybuf,sVar3,metabuf,sVar4,bodybuf,sVar5);
    for (lVar10 = 0; lVar8 != lVar10; lVar10 = lVar10 + 1) {
      fdb_set(db[lVar10],doc[uVar9]);
    }
  }
  fdb_commit(dbfile,'\x01');
  for (uVar9 = 0xf; uVar9 != 0x14; uVar9 = uVar9 + 1) {
    sprintf(keybuf,"key%d",uVar9 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar9 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar9 & 0xffffffff);
    sVar3 = strlen(keybuf);
    sVar4 = strlen(metabuf);
    sVar5 = strlen(bodybuf);
    fdb_doc_create(doc + uVar9,keybuf,sVar3,metabuf,sVar4,bodybuf,sVar5);
    for (lVar10 = 0; lVar8 != lVar10; lVar10 = lVar10 + 1) {
      fdb_set(db[lVar10],doc[uVar9]);
    }
  }
  fdb_commit(dbfile,'\0');
  fVar2 = fdb_open(&dbfile_comp,"./mvcc_test1",&fconfig);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_compact(dbfile_comp,"./mvcc_test2");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1107);
      rollback_to_zero_after_compact_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1107,"void rollback_to_zero_after_compact_test(bool)");
    }
    fdb_close(dbfile_comp);
    uVar9 = 0;
    while( true ) {
      if ((uint)((int)lVar8 << 3) == uVar9) {
        fVar2 = fdb_commit(dbfile,'\x01');
        if (fVar2 == FDB_RESULT_SUCCESS) {
          fdb_close(dbfile);
          iVar1 = local_314;
          for (lVar8 = 0; lVar8 != 0x14; lVar8 = lVar8 + 1) {
            fdb_doc_free(doc[lVar8]);
          }
          fdb_shutdown();
          pcVar6 = "single kv mode:";
          if ((char)iVar1 != '\0') {
            pcVar6 = "multiple kv mode:";
          }
          sprintf(bodybuf,"rollback to zero after compact test %s",pcVar6);
          pcVar6 = "%s PASSED\n";
          if (rollback_to_zero_after_compact_test(bool)::__test_pass != '\0') {
            pcVar6 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar6,bodybuf);
          return;
        }
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x111c);
        rollback_to_zero_after_compact_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x111c,"void rollback_to_zero_after_compact_test(bool)");
      }
      ppfVar7 = (fdb_kvs_handle **)((long)db + uVar9);
      fVar2 = fdb_rollback(ppfVar7,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x110d);
        rollback_to_zero_after_compact_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x110d,"void rollback_to_zero_after_compact_test(bool)");
      }
      fVar2 = fdb_get_kvs_info(*ppfVar7,&info);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x110f);
        rollback_to_zero_after_compact_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x110f,"void rollback_to_zero_after_compact_test(bool)");
      }
      if (info.last_seqnum != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1110);
        rollback_to_zero_after_compact_test(bool)::__test_pass = '\x01';
        if (info.last_seqnum != 0) {
          __assert_fail("info.last_seqnum == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x1110,"void rollback_to_zero_after_compact_test(bool)");
        }
      }
      if (info.doc_count != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1111);
        rollback_to_zero_after_compact_test(bool)::__test_pass = '\x01';
        if (info.doc_count != 0) {
          __assert_fail("info.doc_count == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x1111,"void rollback_to_zero_after_compact_test(bool)");
        }
      }
      if (info.space_used != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1112);
        rollback_to_zero_after_compact_test(bool)::__test_pass = '\x01';
        if (info.space_used != 0) {
          __assert_fail("info.space_used == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x1112,"void rollback_to_zero_after_compact_test(bool)");
        }
      }
      fVar2 = fdb_get(*ppfVar7,doc[0]);
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) break;
      fVar2 = fdb_set(*(fdb_kvs_handle **)((long)db + uVar9),doc[0]);
      uVar9 = uVar9 + 8;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1117);
        rollback_to_zero_after_compact_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x1117,"void rollback_to_zero_after_compact_test(bool)");
      }
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1114);
    rollback_to_zero_after_compact_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1114,"void rollback_to_zero_after_compact_test(bool)");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x1104);
  rollback_to_zero_after_compact_test(bool)::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1104,"void rollback_to_zero_after_compact_test(bool)");
}

Assistant:

void rollback_to_zero_after_compact_test(bool multi_kv)
{
    TEST_INIT();

    int i, r;
    const int n = 20;
    int num_kvs = 4; // keep this the same as number of fdb_commit() calls
    fdb_kvs_handle *db[4]; // same as num_kvs
    fdb_file_handle *dbfile, *dbfile_comp;
    fdb_doc *doc[n];
    fdb_kvs_info info;
    fdb_status status;

    char keybuf[64], metabuf[64], bodybuf[64];
    char kv_name[8];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;

    // open db
    fdb_open(&dbfile, "./mvcc_test1", &fconfig);

    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                         (void *) "rollback_to_zero_after_compact_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

   // ------- Setup test ----------------------------------
   // insert documents of 0-4
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 5 - 9
    for (; i < n/2; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit again without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert documents from 10-14 into HB-trie
    for (; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 15 - 19 on file into the WAL
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // commit without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // open db
    status = fdb_open(&dbfile_comp, "./mvcc_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_compact(dbfile_comp, "./mvcc_test2");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_close(dbfile_comp);

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_rollback(&db[r], 0);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_get_kvs_info(db[r], &info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(info.last_seqnum == 0);
        TEST_CHK(info.doc_count == 0);
        TEST_CHK(info.space_used == 0);
        status = fdb_get(db[r], doc[0]);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        // test normal operation after rollback
        status = fdb_set(db[r], doc[0]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // test normal operation after rollbacks manually flush WAL & commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    sprintf(bodybuf, "rollback to zero after compact test %s",
            multi_kv ? "multiple kv mode:" : "single kv mode:");
    TEST_RESULT(bodybuf);
}